

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedThread.hpp
# Opt level: O2

void __thiscall crsGA::ScopedThread::~ScopedThread(ScopedThread *this)

{
  if ((this->_t)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::thread::~thread(&this->_t);
  return;
}

Assistant:

~ScopedThread()
    {
        if (_t.joinable())
            _t.join();
    }